

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::AssignOp::AssignOp(AssignOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRange *this_00;
  Type TVar1;
  VariableManager *pVVar2;
  ValueEntry **ppVVar3;
  Random *pRVar4;
  deRandom *rnd;
  ValueRangeAccess valueRange_00;
  IsWritableIntersectingEntry filter;
  IsWritableIntersectingEntry filter_00;
  ValueRangeAccess dst;
  ValueEntryIterator<rsg::IsWritableEntry> first;
  ConstValueRangeAccess other;
  ValueEntryIterator<rsg::IsWritableEntry> last;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  Scalar *pSVar8;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  iter;
  Exception *this_01;
  Scalar *pSVar9;
  pointer pSVar10;
  pointer pSVar11;
  int ndx;
  int iVar12;
  ValueEntry **ppVVar13;
  ValueEntry *pVVar14;
  float fVar15;
  StridedValueAccess<1> SVar16;
  undefined1 local_198 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_180 [6];
  VariableType local_118;
  ValueRange *local_c0;
  Scalar *pSStack_b8;
  Scalar *local_b0;
  ConstValueRangeAccess selectedRange;
  ConstValueRangeAccess local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_0072ca00;
  this_00 = &this->m_valueRange;
  ValueRange::ValueRange(this_00,valueRange);
  this->m_rvalueExpr = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_lvalueExpr = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->m_valueRange).m_type.m_baseType == TYPE_VOID) {
    iVar12 = state->m_shaderParams->maxCombinedVariableScalars -
             state->m_varManager->m_numAllocatedScalars;
    bVar5 = VariableManager::hasEntry<rsg::IsWritableEntry>();
    if ((!bVar5) ||
       ((0 < iVar12 && (fVar15 = deRandom_getFloat(&state->m_random->m_rnd), fVar15 < 0.1)))) {
      computeRandomType(&local_118,state,iVar12);
      ValueRange::ValueRange((ValueRange *)local_198,&local_118);
      ValueRange::operator=(this_00,(ValueRange *)local_198);
      ValueRange::~ValueRange((ValueRange *)local_198);
      VariableType::~VariableType(&local_118);
      pSVar8 = (this->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar9 = (this->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pSVar8 == (this->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pSVar8 = (Scalar *)0x0;
      }
      if (pSVar9 == (this->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pSVar9 = (Scalar *)0x0;
      }
      valueRange_00.super_ConstValueRangeAccess.m_min = pSVar8;
      valueRange_00.super_ConstValueRangeAccess.m_type = &this_00->m_type;
      valueRange_00.super_ConstValueRangeAccess.m_max = pSVar9;
      computeRandomValueRange(state,valueRange_00);
    }
    else {
      pRVar4 = state->m_random;
      VariableManager::getBegin<rsg::IsWritableEntry>(&local_48,state->m_varManager);
      local_198._0_8_ =
           (state->m_varManager->m_entryCache).
           super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_118._0_8_ = (Scalar *)0x0;
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_end._M_current = (ValueEntry **)uStack_40;
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current = (ValueEntry **)local_48;
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      ._16_8_ = local_38;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_end._M_current = (ValueEntry **)local_198._0_8_;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current = (ValueEntry **)local_198._0_8_;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      ._16_8_ = local_198._16_8_;
      local_198._8_8_ = local_198._0_8_;
      de::Random::choose<rsg::ValueEntryIterator<rsg::IsWritableEntry>,rsg::ValueEntry_const**>
                (pRVar4,first,last,(ValueEntry **)&local_118,1);
      pSVar10 = *(pointer *)
                 &((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)(local_118._0_8_ + 0x58))->
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>;
      if (*(pointer *)
           &((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)(local_118._0_8_ + 0x58))->
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> ==
          *(pointer *)
           &((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)(local_118._0_8_ + 0x60))->
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>) {
        pSVar10 = (pointer)0x0;
      }
      pSVar11 = *(pointer *)
                 &((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)(local_118._0_8_ + 0x70))->
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>;
      if (*(pointer *)
           &((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)(local_118._0_8_ + 0x70))->
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> ==
          *(pointer *)
           &((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)(local_118._0_8_ + 0x78))->
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>) {
        pSVar11 = (pointer)0x0;
      }
      other.m_min = pSVar10;
      other.m_type = (VariableType *)(local_118._0_8_ + 8);
      other.m_max = pSVar11;
      ValueRange::ValueRange((ValueRange *)local_198,other);
      ValueRange::operator=(this_00,(ValueRange *)local_198);
      ValueRange::~ValueRange((ValueRange *)local_198);
      pSVar10 = (this->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pSVar10 ==
          (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSVar10 = (pointer)0x0;
      }
      pSVar11 = (this->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pSVar11 ==
          (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSVar11 = (pointer)0x0;
      }
      TVar1 = (this->m_valueRange).m_type.m_baseType;
      if (TVar1 != TYPE_BOOL) {
        rnd = &state->m_random->m_rnd;
        if (TVar1 == TYPE_INT) {
          for (iVar12 = 0; iVar12 < (this->m_valueRange).m_type.m_numElements; iVar12 = iVar12 + 1)
          {
            local_198._0_8_ = this_00;
            local_198._8_8_ = pSVar10;
            StridedValueAccess<1>::component((StridedValueAccess<1> *)local_198,iVar12);
          }
        }
        else {
          if (TVar1 != TYPE_FLOAT) {
            this_01 = (Exception *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_198,
                       "computeRandomValueRangeForInfElements(): unsupported type",
                       (allocator<char> *)&local_118);
            Exception::Exception(this_01,(string *)local_198);
            __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
          }
          for (iVar12 = 0; iVar12 < (this->m_valueRange).m_type.m_numElements; iVar12 = iVar12 + 1)
          {
            local_198._0_8_ = this_00;
            local_198._8_8_ = pSVar10;
            SVar16 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_198,iVar12);
            if (((SVar16.super_ConstStridedValueAccess<1>.m_value)->intVal == -0x800000) &&
               (local_118._0_8_ = this_00, local_118.m_typeName._M_dataplus._M_p = (pointer)pSVar11,
               SVar16 = StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_118,iVar12)
               , (SVar16.super_ConstStridedValueAccess<1>.m_value)->intVal == 0x7f800000)) {
              dVar7 = deRandom_getUint32(rnd);
              iVar6 = de::Random::getInt((Random *)rnd,0,0x140 - dVar7 % 0x141);
              fVar15 = (float)iVar6 * 0.1 + -16.0;
              local_198._0_8_ = this_00;
              local_198._8_8_ = pSVar10;
              SVar16 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_198,iVar12);
              (SVar16.super_ConstStridedValueAccess<1>.m_value)->floatVal = fVar15;
              local_198._0_8_ = this_00;
              local_198._8_8_ = pSVar11;
              SVar16 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_198,iVar12);
              (SVar16.super_ConstStridedValueAccess<1>.m_value)->floatVal =
                   (float)(dVar7 % 0x141) * 0.1 + fVar15;
            }
          }
        }
      }
    }
  }
  local_198._8_8_ =
       (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_198._16_8_ =
       (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if ((Scalar *)local_198._8_8_ ==
      (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_198._8_8_ = (Scalar *)0x0;
  }
  pVVar2 = state->m_varManager;
  if ((Scalar *)local_198._16_8_ ==
      (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_198._16_8_ = (Scalar *)0x0;
  }
  iter._M_current =
       (pVVar2->m_entryCache).
       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_198._0_8_ = this_00;
  do {
    ppVVar13 = (pVVar2->m_entryCache).
               super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (iter._M_current == ppVVar13) {
LAB_00540d5d:
      local_118.m_typeName._M_string_length = local_198._16_8_;
      local_118.m_baseType = local_198._0_4_;
      local_118.m_precision = local_198._4_4_;
      local_118.m_typeName._M_dataplus._M_p = (pointer)local_198._8_8_;
      ppVVar3 = (state->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = anon_unknown_0::canAllocateVariable(state,&this_00->m_type);
      if ((!bVar5) ||
         ((iter._M_current != ppVVar3 &&
          (fVar15 = deRandom_getFloat(&state->m_random->m_rnd), 0.5 <= fVar15)))) {
        local_198._16_4_ = local_118.m_baseType;
        local_198._20_4_ = local_118.m_precision;
        aaStack_180[0]._M_allocated_capacity = local_118.m_typeName._M_dataplus._M_p;
        aaStack_180[0]._8_8_ = local_118.m_typeName._M_string_length;
        pSVar10 = (pointer)0x0;
        local_198._8_8_ = ppVVar13;
        for (local_198._0_8_ = iter._M_current; (ValueEntry **)local_198._0_8_ != ppVVar3;
            local_198._0_8_ =
                 FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                 ::findNext(filter,(__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                                    )local_198._0_8_,
                            (__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                             )local_198._8_8_)) {
          pVVar14 = *(ValueEntry **)local_198._0_8_;
          selectedRange.m_min =
               (pVVar14->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          selectedRange.m_max =
               (pVVar14->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (selectedRange.m_min ==
              (pVVar14->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            selectedRange.m_min = pSVar10;
          }
          selectedRange.m_type = &(pVVar14->m_valueRange).m_type;
          if (selectedRange.m_max ==
              (pVVar14->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            selectedRange.m_max = pSVar10;
          }
          local_60.m_min =
               (this->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_60.m_max =
               (this->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (local_60.m_min ==
              (this->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_60.m_min = pSVar10;
          }
          if (local_60.m_max ==
              (this->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_60.m_max = pSVar10;
          }
          local_60.m_type = &this_00->m_type;
          bVar5 = ConstValueRangeAccess::isSupersetOf(&selectedRange,&local_60);
          if (bVar5) {
            return;
          }
          filter.m_valueRange.m_min = (Scalar *)aaStack_180[0]._0_8_;
          filter.m_valueRange.m_type = (VariableType *)local_198._16_8_;
          filter.m_valueRange.m_max = (Scalar *)aaStack_180[0]._8_8_;
        }
        pRVar4 = state->m_random;
        aaStack_180[0]._8_8_ = local_118.m_typeName._M_string_length;
        local_198._16_4_ = local_118.m_baseType;
        local_198._20_4_ = local_118.m_precision;
        aaStack_180[0]._M_allocated_capacity = local_118.m_typeName._M_dataplus._M_p;
        pVVar14 = (ValueEntry *)0x0;
        iVar12 = 0;
        local_198._8_8_ = ppVVar13;
        while (iter._M_current != ppVVar3) {
          local_198._0_8_ = iter._M_current;
          if ((iVar12 < 1) || (iVar6 = de::Random::getInt(pRVar4,0,iVar12), iVar6 < 1)) {
            pVVar14 = *iter._M_current;
          }
          filter_00.m_valueRange.m_min = (Scalar *)aaStack_180[0]._0_8_;
          filter_00.m_valueRange.m_type = (VariableType *)local_198._16_8_;
          filter_00.m_valueRange.m_max = (Scalar *)aaStack_180[0]._8_8_;
          iter = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                 ::findNext(filter_00,iter,
                            (__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                             )local_198._8_8_);
          iVar12 = iVar12 + 1;
        }
        selectedRange.m_type = &(pVVar14->m_valueRange).m_type;
        selectedRange.m_min =
             (pVVar14->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        selectedRange.m_max =
             (pVVar14->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        pSVar8 = (Scalar *)0x0;
        if (selectedRange.m_min ==
            (pVVar14->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          selectedRange.m_min = pSVar8;
        }
        if (selectedRange.m_max ==
            (pVVar14->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          selectedRange.m_max = pSVar8;
        }
        local_198._8_8_ =
             (this->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_198._16_8_ =
             (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((Scalar *)local_198._8_8_ ==
            (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_198._8_8_ = pSVar8;
        }
        if ((Scalar *)local_198._16_8_ ==
            (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_198._16_8_ = pSVar8;
        }
        dst.super_ConstValueRangeAccess.m_min = (Scalar *)local_198._8_8_;
        dst.super_ConstValueRangeAccess.m_type = &this_00->m_type;
        dst.super_ConstValueRangeAccess.m_max = (Scalar *)local_198._16_8_;
        local_198._0_8_ = this_00;
        local_c0 = this_00;
        pSStack_b8 = (Scalar *)local_198._8_8_;
        local_b0 = (Scalar *)local_198._16_8_;
        ValueRange::computeIntersection(dst,(ConstValueRangeAccess *)local_198,&selectedRange);
      }
      return;
    }
    bVar5 = anon_unknown_0::IsWritableIntersectingEntry::operator()
                      ((IsWritableIntersectingEntry *)local_198,*iter._M_current);
    if (bVar5) {
      ppVVar13 = (pVVar2->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00540d5d;
    }
    iter._M_current = iter._M_current + 1;
  } while( true );
}

Assistant:

AssignOp::AssignOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange	(valueRange)
	, m_lvalueExpr	(DE_NULL)
	, m_rvalueExpr	(DE_NULL)
{
	if (m_valueRange.getType().isVoid())
	{
		// Compute random value range
		int		maxScalars		= state.getShaderParameters().maxCombinedVariableScalars - state.getVariableManager().getNumAllocatedScalars();
		bool	useRandomRange	= !state.getVariableManager().hasEntry<IsWritableEntry>() || ((maxScalars > 0) && getWeightedBool(state.getRandom(), 0.1f));

		if (useRandomRange)
		{
			DE_ASSERT(maxScalars > 0);
			m_valueRange = ValueRange(computeRandomType(state, maxScalars));
			computeRandomValueRange(state, m_valueRange.asAccess());
		}
		else
		{
			// Use value range from random entry
			// \todo [2011-02-28 pyry] Give lower weight to entries without range? Choose subtype range?
			const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin<IsWritableEntry>(), state.getVariableManager().getEnd<IsWritableEntry>());
			m_valueRange = ValueRange(entry->getValueRange());

			computeRandomValueRangeForInfElements(state, m_valueRange.asAccess());

			DE_ASSERT(state.getVariableManager().hasEntry(IsWritableIntersectingEntry(m_valueRange.asAccess())));
		}
	}

	IsWritableIntersectingEntry::Iterator first	= state.getVariableManager().getBegin(IsWritableIntersectingEntry(m_valueRange.asAccess()));
	IsWritableIntersectingEntry::Iterator end	= state.getVariableManager().getEnd(IsWritableIntersectingEntry(m_valueRange.asAccess()));

	bool possiblyCreateVar = canAllocateVariable(state, m_valueRange.getType()) &&
							 (first == end || getWeightedBool(state.getRandom(), 0.5f));

	if (!possiblyCreateVar)
	{
		// Find all possible valueranges matching given type and intersecting with valuerange
		// \todo [pyry] Actually collect all ValueRanges, currently operates only on whole variables
		DE_ASSERT(first != end);

		// Try to select one closest to given range but bigger (eg. superset)
		bool supersetExists = false;
		for (IsWritableIntersectingEntry::Iterator i = first; i != end; i++)
		{
			if ((*i)->getValueRange().isSupersetOf(m_valueRange.asAccess()))
			{
				supersetExists = true;
				break;
			}
		}

		if (!supersetExists)
		{
			// Select some other range and compute intersection
			// \todo [2011-02-03 pyry] Use some heuristics to select the range?
			ConstValueRangeAccess selectedRange = state.getRandom().choose<const ValueEntry*>(first, end)->getValueRange();

			ValueRange::computeIntersection(m_valueRange.asAccess(), m_valueRange.asAccess(), selectedRange);
		}
	}
}